

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

int bitset_column_next(ecs_table_t *table,ecs_vector_t *bitset_columns,ecs_query_iter_t *iter,
                      ecs_page_cursor_t *cur)

{
  int iVar1;
  int iVar2;
  ecs_data_t *peVar3;
  ecs_vector_t *peVar4;
  int32_t iVar5;
  int iVar6;
  void *pvVar7;
  int local_b8;
  uint local_b4;
  int32_t elem_count;
  int32_t cur_last;
  int32_t bs_block_end;
  int32_t bs_end;
  uint64_t remain;
  uint64_t v;
  int32_t bs_start;
  uint64_t *data;
  int local_80;
  int32_t bs_block_count;
  int32_t bs_block;
  int32_t bs_elem_count;
  ecs_bitset_t *bs;
  int32_t index;
  ecs_data_t *data_1;
  ecs_bs_column_t *bs_column;
  ecs_bitset_column_t *column;
  uint local_48;
  int32_t last;
  int32_t first;
  int32_t bs_offset;
  ecs_bitset_column_t *columns;
  int32_t count;
  int32_t i;
  ecs_page_cursor_t *cur_local;
  ecs_query_iter_t *iter_local;
  ecs_vector_t *bitset_columns_local;
  ecs_table_t *table_local;
  
  iVar5 = ecs_vector_count(bitset_columns);
  pvVar7 = _ecs_vector_first(bitset_columns,0x10,0x10);
  iVar1 = table->bs_column_offset;
  local_48 = iter->bitset_first;
  column._4_4_ = 0;
  columns._4_4_ = 0;
  do {
    if (iVar5 <= columns._4_4_) {
      iter->bitset_first = column._4_4_;
      return 0;
    }
    data_1 = *(ecs_data_t **)((long)pvVar7 + (long)columns._4_4_ * 0x10);
    if (data_1 == (ecs_data_t *)0x0) {
      peVar3 = table->data;
      iVar2 = *(int *)((long)pvVar7 + (long)columns._4_4_ * 0x10 + 8);
      _ecs_assert(-1 < iVar2 - iVar1,0xc,(char *)0x0,"(index - bs_offset >= 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xa5a);
      if (iVar2 - iVar1 < 0) {
        __assert_fail("(index - bs_offset >= 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0xa5a,
                      "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                     );
      }
      data_1 = (ecs_data_t *)(peVar3->bs_columns + (iVar2 - iVar1));
      *(ecs_data_t **)((long)pvVar7 + (long)columns._4_4_ * 0x10) = data_1;
    }
    iVar2 = *(int *)&data_1->record_ptrs;
    local_80 = (int)local_48 >> 6;
    iVar6 = (iVar2 + -1 >> 6) + 1;
    if (iVar6 <= local_80) {
      return -1;
    }
    peVar4 = data_1->entities;
    v._4_4_ = local_48 & 0x3f;
    _bs_block_end = bitset_column_next::bitmask_remain[(int)v._4_4_];
    remain = *(uint64_t *)(&peVar4->count + (long)local_80 * 2);
    while ((remain & _bs_block_end) == 0) {
      local_80 = local_80 + 1;
      if (iVar6 <= local_80) {
        return -1;
      }
      v._4_4_ = 0;
      _bs_block_end = 0xffffffffffffffff;
      remain = *(uint64_t *)(&peVar4->count + (long)local_80 * 2);
    }
    while ((remain & bitset_column_next::bitmask[(int)v._4_4_]) == 0) {
      v._4_4_ = v._4_4_ + 1;
      _ecs_assert((int)v._4_4_ < 0x40,0xc,(char *)0x0,"bs_start < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xa7f);
      if (0x3f < (int)v._4_4_) {
        __assert_fail("bs_start < 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0xa7f,
                      "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                     );
      }
    }
    cur_last = v._4_4_;
    elem_count = local_80;
    _bs_block_end = bitset_column_next::bitmask_remain[(int)v._4_4_];
    while ((remain & _bs_block_end) == _bs_block_end) {
      cur_last = 0;
      elem_count = elem_count + 1;
      if (elem_count == iVar6) break;
      remain = *(uint64_t *)(&peVar4->count + (long)elem_count * 2);
      _bs_block_end = 0xffffffffffffffff;
    }
    if (elem_count != iVar6) {
      while ((remain & bitset_column_next::bitmask[cur_last]) != 0) {
        cur_last = cur_last + 1;
      }
    }
    _ecs_assert(cur_last < 0x40,0xc,(char *)0x0,"bs_end < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xa9a);
    if (0x3f < cur_last) {
      __assert_fail("bs_end < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0xa9a,
                    "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                   );
    }
    local_48 = local_80 * 0x40 + v._4_4_;
    local_b4 = elem_count * 0x40 + cur_last;
    if (local_48 == local_b4) {
      return -1;
    }
    if (columns._4_4_ == 0) {
LAB_001263a9:
      column._4_4_ = local_b4;
      local_b8 = local_b4 - local_48;
      if (iVar2 < (int)(local_b4 - local_48)) {
        local_b8 = iVar2;
      }
      cur->first = local_48;
      cur->count = local_b8;
      iter->bitset_first = local_48;
    }
    else {
      if ((int)local_48 < (int)column._4_4_) {
        if ((int)column._4_4_ < (int)local_b4) {
          local_b4 = column._4_4_;
        }
        goto LAB_001263a9;
      }
      columns._4_4_ = -1;
    }
    columns._4_4_ = columns._4_4_ + 1;
  } while( true );
}

Assistant:

static
int bitset_column_next(
    ecs_table_t *table,
    ecs_vector_t *bitset_columns,
    ecs_query_iter_t *iter,
    ecs_page_cursor_t *cur)
{
    /* Precomputed single-bit test */
    static const uint64_t bitmask[64] = {
    (uint64_t)1 << 0, (uint64_t)1 << 1, (uint64_t)1 << 2, (uint64_t)1 << 3,
    (uint64_t)1 << 4, (uint64_t)1 << 5, (uint64_t)1 << 6, (uint64_t)1 << 7,
    (uint64_t)1 << 8, (uint64_t)1 << 9, (uint64_t)1 << 10, (uint64_t)1 << 11,
    (uint64_t)1 << 12, (uint64_t)1 << 13, (uint64_t)1 << 14, (uint64_t)1 << 15,
    (uint64_t)1 << 16, (uint64_t)1 << 17, (uint64_t)1 << 18, (uint64_t)1 << 19,
    (uint64_t)1 << 20, (uint64_t)1 << 21, (uint64_t)1 << 22, (uint64_t)1 << 23,
    (uint64_t)1 << 24, (uint64_t)1 << 25, (uint64_t)1 << 26, (uint64_t)1 << 27,  
    (uint64_t)1 << 28, (uint64_t)1 << 29, (uint64_t)1 << 30, (uint64_t)1 << 31,
    (uint64_t)1 << 32, (uint64_t)1 << 33, (uint64_t)1 << 34, (uint64_t)1 << 35,  
    (uint64_t)1 << 36, (uint64_t)1 << 37, (uint64_t)1 << 38, (uint64_t)1 << 39,
    (uint64_t)1 << 40, (uint64_t)1 << 41, (uint64_t)1 << 42, (uint64_t)1 << 43,
    (uint64_t)1 << 44, (uint64_t)1 << 45, (uint64_t)1 << 46, (uint64_t)1 << 47,  
    (uint64_t)1 << 48, (uint64_t)1 << 49, (uint64_t)1 << 50, (uint64_t)1 << 51,
    (uint64_t)1 << 52, (uint64_t)1 << 53, (uint64_t)1 << 54, (uint64_t)1 << 55,  
    (uint64_t)1 << 56, (uint64_t)1 << 57, (uint64_t)1 << 58, (uint64_t)1 << 59,
    (uint64_t)1 << 60, (uint64_t)1 << 61, (uint64_t)1 << 62, (uint64_t)1 << 63
    };

    /* Precomputed test to verify if remainder of block is set (or not) */
    static const uint64_t bitmask_remain[64] = {
    BS_MAX, BS_MAX - (BS_MAX >> 63), BS_MAX - (BS_MAX >> 62),
    BS_MAX - (BS_MAX >> 61), BS_MAX - (BS_MAX >> 60), BS_MAX - (BS_MAX >> 59),
    BS_MAX - (BS_MAX >> 58), BS_MAX - (BS_MAX >> 57), BS_MAX - (BS_MAX >> 56), 
    BS_MAX - (BS_MAX >> 55), BS_MAX - (BS_MAX >> 54), BS_MAX - (BS_MAX >> 53), 
    BS_MAX - (BS_MAX >> 52), BS_MAX - (BS_MAX >> 51), BS_MAX - (BS_MAX >> 50), 
    BS_MAX - (BS_MAX >> 49), BS_MAX - (BS_MAX >> 48), BS_MAX - (BS_MAX >> 47), 
    BS_MAX - (BS_MAX >> 46), BS_MAX - (BS_MAX >> 45), BS_MAX - (BS_MAX >> 44), 
    BS_MAX - (BS_MAX >> 43), BS_MAX - (BS_MAX >> 42), BS_MAX - (BS_MAX >> 41), 
    BS_MAX - (BS_MAX >> 40), BS_MAX - (BS_MAX >> 39), BS_MAX - (BS_MAX >> 38), 
    BS_MAX - (BS_MAX >> 37), BS_MAX - (BS_MAX >> 36), BS_MAX - (BS_MAX >> 35), 
    BS_MAX - (BS_MAX >> 34), BS_MAX - (BS_MAX >> 33), BS_MAX - (BS_MAX >> 32), 
    BS_MAX - (BS_MAX >> 31), BS_MAX - (BS_MAX >> 30), BS_MAX - (BS_MAX >> 29), 
    BS_MAX - (BS_MAX >> 28), BS_MAX - (BS_MAX >> 27), BS_MAX - (BS_MAX >> 26), 
    BS_MAX - (BS_MAX >> 25), BS_MAX - (BS_MAX >> 24), BS_MAX - (BS_MAX >> 23), 
    BS_MAX - (BS_MAX >> 22), BS_MAX - (BS_MAX >> 21), BS_MAX - (BS_MAX >> 20), 
    BS_MAX - (BS_MAX >> 19), BS_MAX - (BS_MAX >> 18), BS_MAX - (BS_MAX >> 17), 
    BS_MAX - (BS_MAX >> 16), BS_MAX - (BS_MAX >> 15), BS_MAX - (BS_MAX >> 14), 
    BS_MAX - (BS_MAX >> 13), BS_MAX - (BS_MAX >> 12), BS_MAX - (BS_MAX >> 11), 
    BS_MAX - (BS_MAX >> 10), BS_MAX - (BS_MAX >> 9), BS_MAX - (BS_MAX >> 8), 
    BS_MAX - (BS_MAX >> 7), BS_MAX - (BS_MAX >> 6), BS_MAX - (BS_MAX >> 5), 
    BS_MAX - (BS_MAX >> 4), BS_MAX - (BS_MAX >> 3), BS_MAX - (BS_MAX >> 2),
    BS_MAX - (BS_MAX >> 1)
    };

    int32_t i, count = ecs_vector_count(bitset_columns);
    ecs_bitset_column_t *columns = ecs_vector_first(
        bitset_columns, ecs_bitset_column_t);
    int32_t bs_offset = table->bs_column_offset;

    int32_t first = iter->bitset_first;
    int32_t last = 0;

    for (i = 0; i < count; i ++) {
        ecs_bitset_column_t *column = &columns[i];
        ecs_bs_column_t *bs_column = columns[i].bs_column;

        if (!bs_column) {
            ecs_data_t *data = table->data;
            int32_t index = column->column_index;
            ecs_assert((index - bs_offset >= 0), ECS_INTERNAL_ERROR, NULL);
            bs_column = &data->bs_columns[index - bs_offset];
            columns[i].bs_column = bs_column;
        }
        
        ecs_bitset_t *bs = &bs_column->data;
        int32_t bs_elem_count = bs->count;
        int32_t bs_block = first >> 6;
        int32_t bs_block_count = ((bs_elem_count - 1) >> 6) + 1;

        if (bs_block >= bs_block_count) {
            goto done;
        }

        uint64_t *data = bs->data;
        int32_t bs_start = first & 0x3F;

        /* Step 1: find the first non-empty block */
        uint64_t v = data[bs_block];
        uint64_t remain = bitmask_remain[bs_start];
        while (!(v & remain)) {
            /* If no elements are remaining, move to next block */
            if ((++bs_block) >= bs_block_count) {
                /* No non-empty blocks left */
                goto done;
            }

            bs_start = 0;
            remain = BS_MAX; /* Test the full block */
            v = data[bs_block];
        }

        /* Step 2: find the first non-empty element in the block */
        while (!(v & bitmask[bs_start])) {
            bs_start ++;

            /* Block was not empty, so bs_start must be smaller than 64 */
            ecs_assert(bs_start < 64, ECS_INTERNAL_ERROR, NULL);
        }
        
        /* Step 3: Find number of contiguous enabled elements after start */
        int32_t bs_end = bs_start, bs_block_end = bs_block;
        
        remain = bitmask_remain[bs_end];
        while ((v & remain) == remain) {
            bs_end = 0;
            bs_block_end ++;

            if (bs_block_end == bs_block_count) {
                break;
            }

            v = data[bs_block_end];
            remain = BS_MAX; /* Test the full block */
        }

        /* Step 4: find remainder of enabled elements in current block */
        if (bs_block_end != bs_block_count) {
            while ((v & bitmask[bs_end])) {
                bs_end ++;
            }
        }

        /* Block was not 100% occupied, so bs_start must be smaller than 64 */
        ecs_assert(bs_end < 64, ECS_INTERNAL_ERROR, NULL);

        /* Step 5: translate to element start/end and make sure that each column
         * range is a subset of the previous one. */
        first = bs_block * 64 + bs_start;
        int32_t cur_last = bs_block_end * 64 + bs_end;
        
        /* No enabled elements found in table */
        if (first == cur_last) {
            goto done;
        }

        /* If multiple bitsets are evaluated, make sure each subsequent range
         * is equal or a subset of the previous range */
        if (i) {
            /* If the first element of a subsequent bitset is larger than the
             * previous last value, start over. */
            if (first >= last) {
                i = -1;
                continue;
            }

            /* Make sure the last element of the range doesn't exceed the last
             * element of the previous range. */
            if (cur_last > last) {
                cur_last = last;
            }
        }
        
        last = cur_last;
        int32_t elem_count = last - first;

        /* Make sure last element doesn't exceed total number of elements in 
         * the table */
        if (elem_count > bs_elem_count) {
            elem_count = bs_elem_count;
        }
        
        cur->first = first;
        cur->count = elem_count;
        iter->bitset_first = first;
    }
    
    /* Keep track of last processed element for iteration */ 
    iter->bitset_first = last;

    return 0;
done:
    return -1;
}